

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPreData.cpp
# Opt level: O2

double __thiscall HPreData::getaij(HPreData *this,int i,int j)

{
  pointer piVar1;
  long lVar2;
  long lVar3;
  
  piVar1 = (this->ARstart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar2 = (long)piVar1[i] + -1;
  do {
    lVar3 = lVar2;
    if ((this->ARindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[lVar3 + 1] == j) break;
    lVar2 = lVar3 + 1;
  } while (lVar3 + 1 <= (long)piVar1[(long)i + 1]);
  return (this->ARvalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start[lVar3 + 1];
}

Assistant:

double HPreData::getaij(int i, int j) {
	int k=ARstart[i];
    while (j != ARindex[k] && k<=ARstart[i+1])
            k++;
    if (k==ARstart[i+1]) {
    	//cout<<"Error: No such element in A: row "<<i<<", column "<<j<<endl;
    	//exit(0);
    	}
    return ARvalue[k];
}